

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O0

int anon_unknown.dwarf_6c37a::CategorizedHelpPrinter::OptionCategoryCompare
              (OptionCategory **A,OptionCategory **B)

{
  char *pcVar1;
  unsigned_long *puVar2;
  StringRef SVar3;
  char *local_80;
  size_t local_78;
  StringRef local_70;
  OptionCategory **local_60;
  OptionCategory **B_local;
  OptionCategory **A_local;
  StringRef *pSStack_48;
  int Res;
  char *local_40;
  size_t local_38;
  int local_2c;
  size_t local_28;
  char *local_20;
  char *local_18;
  int local_c;
  
  local_60 = B;
  B_local = A;
  local_70 = llvm::cl::OptionCategory::getName(*A);
  SVar3 = llvm::cl::OptionCategory::getName(*local_60);
  local_80 = SVar3.Data;
  local_78 = SVar3.Length;
  local_40 = local_80;
  local_38 = local_78;
  pSStack_48 = &local_70;
  pcVar1 = local_70.Data;
  puVar2 = std::min<unsigned_long>(&local_70.Length,&local_38);
  local_28 = *puVar2;
  local_20 = local_80;
  if (local_28 == 0) {
    local_c = 0;
  }
  else {
    local_18 = pcVar1;
    local_c = memcmp(pcVar1,local_80,local_28);
  }
  if (local_c == 0) {
    if (local_70.Length == local_38) {
      local_2c = 0;
    }
    else {
      local_2c = 1;
      if (local_70.Length < local_38) {
        local_2c = -1;
      }
    }
  }
  else {
    local_2c = 1;
    if (local_c < 0) {
      local_2c = -1;
    }
  }
  return local_2c;
}

Assistant:

static int OptionCategoryCompare(OptionCategory *const *A,
                                   OptionCategory *const *B) {
    return (*A)->getName().compare((*B)->getName());
  }